

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  sigaction *__act;
  TestInfo *pTVar1;
  InternalRunDeathTestFlag *pIVar2;
  bool bVar3;
  int iVar4;
  __pid_t _Var5;
  UnitTestImpl *pUVar6;
  void *__addr;
  int *piVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  size_t __len;
  undefined1 local_308 [8];
  string filter_flag;
  string internal_flag;
  sigaction ignore_sigprof_action;
  sigaction saved_sigprof_action;
  ExecDeathTestArgs args_2;
  vector<char_*,_std::allocator<char_*>_> argv;
  undefined1 local_168 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string local_148;
  int local_124;
  int local_120;
  int death_test_index;
  int pipe_fd [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  bool result_1;
  int local_38;
  allocator<char> local_31;
  
  pUVar6 = GetUnitTestImpl();
  pTVar1 = pUVar6->current_test_info_;
  pIVar2 = (pUVar6->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_124 = (pTVar1->result_).death_test_count_;
  if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar2->write_fd_;
    return EXECUTE_TEST;
  }
  do {
    iVar4 = pipe(&local_120);
    bVar3 = IsTrue(iVar4 != -1);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"CHECK failed: File ",(allocator<char> *)pipe_fd);
      std::operator+(&local_98,&local_b8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     &local_98,", line ");
      local_f8._M_dataplus._M_p._0_4_ = 0x557;
      StreamableToString<int>(&local_d8,(int *)&local_f8);
      std::operator+(&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     &local_d8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&internal_flag.field_2 + 8),&local_78,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ignore_sigprof_action.sa_restorer,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&internal_flag.field_2 + 8),"pipe(pipe_fd) != -1");
      DeathTestAbort((string *)&ignore_sigprof_action.sa_restorer);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  do {
    iVar4 = fcntl(death_test_index,2,0);
    bVar3 = IsTrue(iVar4 != -1);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"CHECK failed: File ",(allocator<char> *)pipe_fd);
      std::operator+(&local_98,&local_b8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     &local_98,", line ");
      local_f8._M_dataplus._M_p._0_4_ = 0x55a;
      StreamableToString<int>(&local_d8,(int *)&local_f8);
      std::operator+(&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     &local_d8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&internal_flag.field_2 + 8),&local_78,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ignore_sigprof_action.sa_restorer,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&internal_flag.field_2 + 8),"fcntl(pipe_fd[1], F_SETFD, 0) != -1");
      DeathTestAbort((string *)&ignore_sigprof_action.sa_restorer);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"--",(allocator<char> *)&local_b8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_98,"gtest_");
  std::operator+(&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 "filter=");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&internal_flag.field_2 + 8),&local_78,
                 (pTVar1->test_suite_name_)._M_dataplus._M_p);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action.sa_restorer,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&internal_flag.field_2 + 8),".");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action.sa_restorer,(pTVar1->name_)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&ignore_sigprof_action.sa_restorer);
  std::__cxx11::string::~string((string *)(internal_flag.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pipe_fd,"--",(allocator<char> *)&saved_sigprof_action.sa_restorer);
  std::operator+(&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                 "gtest_");
  std::operator+(&local_d8,&local_f8,"internal_run_death_test=");
  std::operator+(&local_b8,&local_d8,this->file_);
  std::operator+(&local_98,&local_b8,"|");
  StreamableToString<int>(&local_148,&this->line_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_98,&local_148);
  std::operator+(&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,"|");
  StreamableToString<int>((string *)local_168,&local_124);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&internal_flag.field_2 + 8),&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action.sa_restorer,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&internal_flag.field_2 + 8),"|");
  StreamableToString<int>((string *)&args_2.close_fd,&death_test_index);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&filter_flag.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action.sa_restorer,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &args_2.close_fd);
  std::__cxx11::string::~string((string *)&args_2.close_fd);
  std::__cxx11::string::~string((string *)&ignore_sigprof_action.sa_restorer);
  std::__cxx11::string::~string((string *)(internal_flag.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)pipe_fd);
  GetInjectableArgvs_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_168,(value_type *)local_308);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_168,(value_type *)((long)&filter_flag.field_2 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ignore_sigprof_action.sa_restorer,"",
             (allocator<char> *)(internal_flag.field_2._M_local_buf + 8));
  DeathTest::set_last_death_test_message((string *)&ignore_sigprof_action.sa_restorer);
  std::__cxx11::string::~string((string *)&ignore_sigprof_action.sa_restorer);
  CaptureStderr();
  FlushInfoLog();
  args_2.close_fd = 0;
  args_2._12_4_ = 0;
  std::vector<char_*,_std::allocator<char_*>_>::reserve
            ((vector<char_*,_std::allocator<char_*>_> *)&args_2.close_fd,
             ((long)args.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)local_168 >> 5) + 1);
  for (; local_168 !=
         (undefined1  [8])
         args.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
      local_168 = (undefined1  [8])((long)local_168 + 0x20)) {
    ignore_sigprof_action.sa_restorer = (_func_void *)(((pointer)local_168)->_M_dataplus)._M_p;
    std::vector<char*,std::allocator<char*>>::emplace_back<char*>
              ((vector<char*,std::allocator<char*>> *)&args_2.close_fd,
               (char **)&ignore_sigprof_action.sa_restorer);
  }
  ignore_sigprof_action.sa_restorer = (_func_void *)0x0;
  std::vector<char*,std::allocator<char*>>::emplace_back<char*>
            ((vector<char*,std::allocator<char*>> *)&args_2.close_fd,
             (char **)&ignore_sigprof_action.sa_restorer);
  saved_sigprof_action.sa_restorer = (_func_void *)args_2._8_8_;
  args_2.argv._0_4_ = local_120;
  __act = (sigaction *)((long)&internal_flag.field_2 + 8);
  memset(__act,0,0x98);
  sigemptyset((sigset_t *)&ignore_sigprof_action);
  internal_flag.field_2._8_8_ = 1;
  do {
    while (iVar4 = sigaction(0x1b,__act,(sigaction *)&ignore_sigprof_action.sa_restorer),
          iVar4 == -1) {
      piVar7 = __errno_location();
      if (*piVar7 != 4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)pipe_fd,"CHECK failed: File ",&local_31);
        std::operator+(&local_f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_d8,&local_f8,", line ");
        local_38 = 0x515;
        StreamableToString<int>(&local_148,&local_38);
        std::operator+(&local_b8,&local_d8,&local_148);
        std::operator+(&local_98,&local_b8,": ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,&local_98,
                       "sigaction(SIGPROF, &ignore_sigprof_action, &saved_sigprof_action)");
        std::operator+(&local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ," != -1");
        DeathTestAbort(&local_78);
      }
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  if (FLAGS_gtest_death_test_use_fork != '\0') {
    _Var5 = fork();
    if (_Var5 != 0) goto LAB_00126122;
    ExecDeathTestChildMain(&saved_sigprof_action.sa_restorer);
  }
  if ((ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') &&
     (iVar4 = __cxa_guard_acquire(), iVar4 != 0)) {
    StackLowerThanAddress(&local_78,(bool *)local_58);
    ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down = local_58[0];
    __cxa_guard_release();
  }
  iVar4 = getpagesize();
  __len = (size_t)(iVar4 * 2);
  __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
  do {
    bVar3 = IsTrue(__addr != (void *)0xffffffffffffffff);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"CHECK failed: File ",(allocator<char> *)&local_38);
      std::operator+(&local_d8,&local_f8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_b8,&local_d8,", line ");
      local_148._M_dataplus._M_p._0_4_ = 0x521;
      StreamableToString<int>((string *)pipe_fd,(int *)&local_148);
      std::operator+(&local_98,&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     &local_98,": ");
      std::operator+(&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "stack != MAP_FAILED");
      DeathTestAbort(&local_78);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  lVar8 = 0;
  if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != (string)0x0) {
    lVar8 = __len - 0x40;
  }
  do {
    bVar3 = IsTrue(((ulong)((long)__addr + lVar8) & 0x3f) == 0 && 0x40 < (uint)(iVar4 * 2));
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"CHECK failed: File ",(allocator<char> *)&local_38);
      std::operator+(&local_d8,&local_f8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_b8,&local_d8,", line ");
      local_148._M_dataplus._M_p._0_4_ = 0x52f;
      StreamableToString<int>((string *)pipe_fd,(int *)&local_148);
      std::operator+(&local_98,&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     &local_98,": ");
      std::operator+(&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "static_cast<size_t>(stack_size) > kMaxStackAlignment && reinterpret_cast<uintptr_t>(stack_top) % kMaxStackAlignment == 0"
                    );
      DeathTestAbort(&local_78);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  _Var5 = clone(ExecDeathTestChildMain,(void *)((long)__addr + lVar8),0x11,
                &saved_sigprof_action.sa_restorer);
  do {
    iVar4 = munmap(__addr,__len);
    bVar3 = IsTrue(iVar4 != -1);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"CHECK failed: File ",(allocator<char> *)&local_38);
      std::operator+(&local_d8,&local_f8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_b8,&local_d8,", line ");
      local_148._M_dataplus._M_p._0_4_ = 0x533;
      StreamableToString<int>((string *)pipe_fd,(int *)&local_148);
      std::operator+(&local_98,&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     &local_98,": ");
      std::operator+(&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "munmap(stack, stack_size) != -1");
      DeathTestAbort(&local_78);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
LAB_00126122:
  do {
    while (iVar4 = sigaction(0x1b,(sigaction *)&ignore_sigprof_action.sa_restorer,(sigaction *)0x0),
          iVar4 == -1) {
      piVar7 = __errno_location();
      if (*piVar7 != 4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)pipe_fd,"CHECK failed: File ",&local_31);
        std::operator+(&local_f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_d8,&local_f8,", line ");
        local_38 = 0x53f;
        StreamableToString<int>(&local_148,&local_38);
        std::operator+(&local_b8,&local_d8,&local_148);
        std::operator+(&local_98,&local_b8,": ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,&local_98,"sigaction(SIGPROF, &saved_sigprof_action, nullptr)");
        std::operator+(&local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ," != -1");
        DeathTestAbort(&local_78);
      }
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  do {
    bVar3 = IsTrue(_Var5 != -1);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"CHECK failed: File ",(allocator<char> *)&local_38);
      std::operator+(&local_d8,&local_f8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_b8,&local_d8,", line ");
      local_148._M_dataplus._M_p._0_4_ = 0x542;
      StreamableToString<int>((string *)pipe_fd,(int *)&local_148);
      std::operator+(&local_98,&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     &local_98,": ");
      std::operator+(&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "child_pid != -1");
      DeathTestAbort(&local_78);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  do {
    while (iVar4 = close(death_test_index), iVar4 == -1) {
      piVar7 = __errno_location();
      if (*piVar7 != 4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"CHECK failed: File ",(allocator<char> *)&local_148);
        std::operator+(&local_b8,&local_d8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_98,&local_b8,", line ");
        pipe_fd[0] = 0x571;
        StreamableToString<int>(&local_f8,pipe_fd);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,&local_98,&local_f8);
        std::operator+(&local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,": ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&internal_flag.field_2 + 8),&local_78,"close(pipe_fd[1])");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action.sa_restorer,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&internal_flag.field_2 + 8)," != -1");
        DeathTestAbort((string *)&ignore_sigprof_action.sa_restorer);
      }
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var5;
  (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_120;
  (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            ((_Vector_base<char_*,_std::allocator<char_*>_> *)&args_2.close_fd);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_168);
  std::__cxx11::string::~string((string *)(filter_flag.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_308);
  return OVERSEE_TEST;
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  "filter=" + info->test_suite_name() + "." +
                                  info->name();
  const std::string internal_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                    "internal_run_death_test=" + file_ + "|" +
                                    StreamableToString(line_) + "|" +
                                    StreamableToString(death_test_index) + "|" +
                                    StreamableToString(pipe_fd[1]);
  std::vector<std::string> args = GetArgvsForDeathTestChildProcess();
  args.push_back(filter_flag);
  args.push_back(internal_flag);

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  std::vector<char*> argv = CreateArgvFromArgs(args);
  const pid_t child_pid = ExecDeathTestSpawnChild(argv.data(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}